

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::checkLocation(TParseContext *this,TSourceLoc *loc,TOperator op)

{
  int *piVar1;
  TIntermediate *pTVar2;
  char *pcVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  if (op != EOpEndInvocationInterlock) {
    if (op != EOpBeginInvocationInterlock) {
      if (op != EOpBarrier) {
        return;
      }
      if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) {
        return;
      }
      if (0 < (this->super_TParseContextBase).controlFlowNestingLevel) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"tessellation control barrier() cannot be placed within flow control",""
                   ,"");
      }
      if (this->inMain == false) {
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar3 = "tessellation control barrier() must be in main()";
      }
      else {
        if ((this->super_TParseContextBase).postEntryPointReturn != true) {
          return;
        }
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar3 = "tessellation control barrier() cannot be placed after a return from main()";
      }
      (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar3,"","",UNRECOVERED_JUMPTABLE);
      return;
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() must be in a fragment shader","","");
    }
    if (this->inMain == true) {
      if ((this->super_TParseContextBase).postEntryPointReturn != true) goto LAB_00424648;
      pcVar3 = "beginInvocationInterlockARB() cannot be placed after a return from main()";
    }
    else {
      pcVar3 = "beginInvocationInterlockARB() must be in main()";
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,pcVar3,"","");
LAB_00424648:
    if (0 < (this->super_TParseContextBase).controlFlowNestingLevel) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() cannot be placed within flow control","",""
                );
    }
    if (0 < (this->super_TParseContextBase).beginInvocationInterlockCount) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() must only be called once","","");
    }
    if (0 < (this->super_TParseContextBase).endInvocationInterlockCount) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()",
                 "","");
    }
    piVar1 = &(this->super_TParseContextBase).beginInvocationInterlockCount;
    *piVar1 = *piVar1 + 1;
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if (pTVar2->interlockOrdering != EioNone) {
      return;
    }
    pTVar2->interlockOrdering = EioPixelInterlockOrdered;
    return;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"endInvocationInterlockARB() must be in a fragment shader","","");
  }
  if (this->inMain == true) {
    if ((this->super_TParseContextBase).postEntryPointReturn != true) goto LAB_00424715;
    pcVar3 = "endInvocationInterlockARB() cannot be placed after a return from main()";
  }
  else {
    pcVar3 = "endInvocationInterlockARB() must be in main()";
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,pcVar3,"","");
LAB_00424715:
  if (0 < (this->super_TParseContextBase).controlFlowNestingLevel) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"endInvocationInterlockARB() cannot be placed within flow control","","");
  }
  if (0 < (this->super_TParseContextBase).endInvocationInterlockCount) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"endInvocationInterlockARB() must only be called once","","");
  }
  if ((this->super_TParseContextBase).beginInvocationInterlockCount == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()","",
               "");
  }
  piVar1 = &(this->super_TParseContextBase).endInvocationInterlockCount;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void TParseContext::checkLocation(const TSourceLoc& loc, TOperator op)
{
    switch (op) {
    case EOpBarrier:
        if (language == EShLangTessControl) {
            if (controlFlowNestingLevel > 0)
                error(loc, "tessellation control barrier() cannot be placed within flow control", "", "");
            if (! inMain)
                error(loc, "tessellation control barrier() must be in main()", "", "");
            else if (postEntryPointReturn)
                error(loc, "tessellation control barrier() cannot be placed after a return from main()", "", "");
        }
        break;
    case EOpBeginInvocationInterlock:
        if (language != EShLangFragment)
            error(loc, "beginInvocationInterlockARB() must be in a fragment shader", "", "");
        if (! inMain)
            error(loc, "beginInvocationInterlockARB() must be in main()", "", "");
        else if (postEntryPointReturn)
            error(loc, "beginInvocationInterlockARB() cannot be placed after a return from main()", "", "");
        if (controlFlowNestingLevel > 0)
            error(loc, "beginInvocationInterlockARB() cannot be placed within flow control", "", "");

        if (beginInvocationInterlockCount > 0)
            error(loc, "beginInvocationInterlockARB() must only be called once", "", "");
        if (endInvocationInterlockCount > 0)
            error(loc, "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()", "", "");

        beginInvocationInterlockCount++;

        // default to pixel_interlock_ordered
        if (intermediate.getInterlockOrdering() == EioNone)
            intermediate.setInterlockOrdering(EioPixelInterlockOrdered);
        break;
    case EOpEndInvocationInterlock:
        if (language != EShLangFragment)
            error(loc, "endInvocationInterlockARB() must be in a fragment shader", "", "");
        if (! inMain)
            error(loc, "endInvocationInterlockARB() must be in main()", "", "");
        else if (postEntryPointReturn)
            error(loc, "endInvocationInterlockARB() cannot be placed after a return from main()", "", "");
        if (controlFlowNestingLevel > 0)
            error(loc, "endInvocationInterlockARB() cannot be placed within flow control", "", "");

        if (endInvocationInterlockCount > 0)
            error(loc, "endInvocationInterlockARB() must only be called once", "", "");
        if (beginInvocationInterlockCount == 0)
            error(loc, "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()", "", "");

        endInvocationInterlockCount++;
        break;
    default:
        break;
    }
}